

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O2

void cpu_common_initfn(uc_struct *uc,CPUState *cs)

{
  cs->cpu_index = -1;
  cs->cluster_index = -1;
  cs->nr_cores = 1;
  cs->nr_threads = 1;
  (cs->breakpoints).tqh_first = (CPUBreakpoint *)0x0;
  (cs->breakpoints).tqh_circ.tql_prev = (QTailQLink *)&cs->breakpoints;
  (cs->watchpoints).tqh_first = (CPUWatchpoint *)0x0;
  (cs->watchpoints).tqh_circ.tql_prev = (QTailQLink *)&cs->watchpoints;
  cs->num_ases = 1;
  cs->as = &cs->uc->address_space_memory;
  cs->memory = cs->uc->system_memory;
  return;
}

Assistant:

void cpu_common_initfn(struct uc_struct *uc, CPUState *cs)
{
    CPUState *cpu = CPU(cs);

    cpu->cpu_index = UNASSIGNED_CPU_INDEX;
    cpu->cluster_index = UNASSIGNED_CLUSTER_INDEX;
    /* *-user doesn't have configurable SMP topology */
    /* the default value is changed by qemu_init_vcpu() for softmmu */
    cpu->nr_cores = 1;
    cpu->nr_threads = 1;

    QTAILQ_INIT(&cpu->breakpoints);
    QTAILQ_INIT(&cpu->watchpoints);

    /* cpu_exec_initfn(cpu); */
    cpu->num_ases = 1;
    cpu->as = &(cpu->uc->address_space_memory);
    cpu->memory = cpu->uc->system_memory;
}